

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.cpp
# Opt level: O0

int __thiscall FTagManager::GetFirstLineID(FTagManager *this,line_t_conflict *line)

{
  bool bVar1;
  int sect;
  int *piVar2;
  FTagItem *pFVar3;
  int local_2c;
  int i;
  line_t_conflict *line_local;
  FTagManager *this_local;
  
  sect = lineindex(line);
  bVar1 = LineHasIDs(this,sect);
  if (bVar1) {
    piVar2 = TArray<int,_int>::operator[](&this->startForLine,(long)sect);
    pFVar3 = TArray<FTagItem,_FTagItem>::operator[](&this->allIDs,(long)*piVar2);
    local_2c = pFVar3->tag;
  }
  else {
    local_2c = 0;
  }
  return local_2c;
}

Assistant:

int FTagManager::GetFirstLineID(const line_t *line) const
{
	int i = lineindex(line);
	return LineHasIDs(i) ? allIDs[startForLine[i]].tag : 0;
}